

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.c
# Opt level: O1

void sscep_engine_read_key_capi_cold_2(void)

{
  fprintf(_stderr,"%s: Executing CAPI_CMD_STORE_FLAGS did not succeed\n",pname);
  sscep_engine_report_error();
  exit(1);
}

Assistant:

ENGINE *scep_engine_init(ENGINE *e) {
    

        ENGINE_load_builtin_engines();
        ENGINE_load_dynamic();
        //if its not dynamic, try to load it directly. If OpenSSL has it already we are good to go!
        if(strcmp(g_char, "dynamic") != 0)
        {
            e = ENGINE_by_id(g_char);
            if ((e==NULL) && v_flag){
                printf("%s: Engine %s could not be loaded. Trying to load dynamically...\n", pname, g_char);
            }
        }

        if(e == NULL)
        {
            ERR_clear_error();
            e = scep_engine_load_dynamic(e);
        }

        if(scep_conf->engine->module_path) {
            if(ENGINE_ctrl_cmd_string(e, "MODULE_PATH", scep_conf->engine->module_path, 0) == 0) {
                fprintf(stderr, "%s: Adding MODULE PATH %s was not successful!\n", pname, scep_conf->engine->module_path);
                sscep_engine_report_error();
                exit (SCEP_PKISTATUS_ERROR);
            }
        }

        //define this engine as a default for all our crypto operations. This way OpenSSL automatically chooses the right functions
        if(ENGINE_set_default(e, ENGINE_METHOD_ALL) == 0) {
                fprintf(stderr, "%s: Error loading on setting defaults\n", pname);
                sscep_engine_report_error();
                exit (SCEP_PKISTATUS_ERROR);
        } else if(v_flag)
            printf("%s: Engine %s made default for all operations\n", pname, g_char);

        //we need a functional reference and as such need to initialize
        if(ENGINE_init(e) == 0) {
            fprintf(stderr, "%s: Engine Init did not work\n", pname);
            sscep_engine_report_error();
            exit (SCEP_PKISTATUS_ERROR);
        } else if(v_flag)
            printf("%s: Engine %s initialized\n", pname, g_char);


        //TODO: remove capi specific part!
        if(v_flag && strncmp(scep_conf->engine->engine_id, "capi", 4) == 0) {
            // set debug level
            if(!ENGINE_ctrl(e, (ENGINE_CMD_BASE + 2), 2, NULL, NULL)) {
                fprintf(stderr, "%s: Could not set debug level to %i\n", pname, 2);
                sscep_engine_report_error();
                exit (SCEP_PKISTATUS_ERROR);
            }
            // set debug file (log)
            if(!ENGINE_ctrl(e, (ENGINE_CMD_BASE + 3), 0, "capi.log", NULL)) {
                fprintf(stderr, "%s: Could not set debug file to %s\n", pname, "capi.log");
                sscep_engine_report_error();
                exit (SCEP_PKISTATUS_ERROR);
            }
        }

        //TODO: remove JKSEngine specific part!
        if(strncmp(scep_conf->engine->engine_id, "jksengine", 9) == 0) {
            if(scep_conf->engine->storepass) {
                if(!ENGINE_ctrl(e, 2, 0, scep_conf->engine->storepass, NULL)) {
                    fprintf(stderr, "%s: Could not set %s\n", pname, SCEP_CONFIGURATION_ENGINE_JKSENGINE_KEYSTOREPASS);
                    sscep_engine_report_error();
                    exit (SCEP_PKISTATUS_ERROR);
                }
            }

            if(scep_conf->engine->jconnpath) {
                if(!ENGINE_ctrl(e, 3, 0, scep_conf->engine->jconnpath, 0)) {
                    fprintf(stderr, "%s: Could not set %s\n", pname, SCEP_CONFIGURATION_ENGINE_JKSENGINE_JCONNPATH);
                    sscep_engine_report_error();
                    exit (SCEP_PKISTATUS_ERROR);
                }
            }

            if(scep_conf->engine->provider) {
                if(!ENGINE_ctrl(e, 4, 0, scep_conf->engine->provider, 0)) {
                    fprintf(stderr, "%s: Could not set %s\n", pname, SCEP_CONFIGURATION_ENGINE_JKSENGINE_PROVIDER);
                    sscep_engine_report_error();
                    exit (SCEP_PKISTATUS_ERROR);
                }
            }

            if(scep_conf->engine->javapath) {
                if(!ENGINE_ctrl(e, 5, 0, scep_conf->engine->javapath, 0)) {
                    fprintf(stderr, "%s: Could not set %s\n", pname, SCEP_CONFIGURATION_ENGINE_JKSENGINE_JAVAPATH);
                    sscep_engine_report_error();
                    exit (SCEP_PKISTATUS_ERROR);
                }
            }
        }

        //TODO: remove pkcs11 specific part!
        if(strncmp(scep_conf->engine->engine_id, "pkcs11", 6) == 0) {
            if(scep_conf->engine->pin) {
                if(!ENGINE_ctrl(e, (ENGINE_CMD_BASE + 2), 0, scep_conf->engine->pin, NULL)) {
                    fprintf(stderr, "%s: Could not define PIN\n", pname);
                    sscep_engine_report_error();
                    exit (SCEP_PKISTATUS_ERROR);
                }
            }
        }


        return e;
}